

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_message.c
# Opt level: O0

MQTT_MESSAGE_HANDLE
mqttmessage_create(uint16_t packetId,char *topicName,QOS_VALUE qosValue,uint8_t *appMsg,
                  size_t appMsgLength)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  uint8_t *puVar3;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  MQTT_MESSAGE *result;
  size_t appMsgLength_local;
  uint8_t *appMsg_local;
  QOS_VALUE qosValue_local;
  char *topicName_local;
  uint16_t packetId_local;
  
  if (topicName == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_message.c"
                ,"mqttmessage_create",0x54,1,"Invalid Parameter topicName: %p, packetId: %d.",0,
                (uint)packetId);
    }
    l = (LOGGER_LOG)0x0;
  }
  else {
    l = (LOGGER_LOG)create_msg_object(packetId,qosValue);
    if ((MQTT_MESSAGE *)l == (MQTT_MESSAGE *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_message.c"
                  ,"mqttmessage_create",0x5e,1,"Failure creating message object");
      }
    }
    else {
      iVar1 = mallocAndStrcpy_s(&((MQTT_MESSAGE *)l)->topicName,topicName);
      if (iVar1 == 0) {
        (((MQTT_MESSAGE *)l)->appPayload).length = appMsgLength;
        if ((((MQTT_MESSAGE *)l)->appPayload).length == 0) {
          (((MQTT_MESSAGE *)l)->appPayload).message = (uint8_t *)0x0;
        }
        else {
          puVar3 = (uint8_t *)malloc(appMsgLength);
          (((MQTT_MESSAGE *)l)->appPayload).message = puVar3;
          if ((((MQTT_MESSAGE *)l)->appPayload).message == (uint8_t *)0x0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_message.c"
                        ,"mqttmessage_create",0x73,1,"Failure allocating message value of %lu",
                        appMsgLength);
            }
            free(((MQTT_MESSAGE *)l)->topicName);
            free(l);
            l = (LOGGER_LOG)0x0;
          }
          else {
            memcpy((((MQTT_MESSAGE *)l)->appPayload).message,appMsg,appMsgLength);
          }
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/src/mqtt_message.c"
                    ,"mqttmessage_create",0x65,1,"Failure allocating topic name");
        }
        free(l);
        l = (LOGGER_LOG)0x0;
      }
    }
  }
  return (MQTT_MESSAGE_HANDLE)l;
}

Assistant:

MQTT_MESSAGE_HANDLE mqttmessage_create(uint16_t packetId, const char* topicName, QOS_VALUE qosValue, const uint8_t* appMsg, size_t appMsgLength)
{
    /* Codes_SRS_MQTTMESSAGE_07_001:[If the parameters topicName is NULL is zero then mqttmessage_create shall return NULL.] */
    MQTT_MESSAGE* result;
    if (topicName == NULL)
    {
        LogError("Invalid Parameter topicName: %p, packetId: %d.", topicName, packetId);
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MQTTMESSAGE_07_002: [mqttmessage_create shall allocate and copy the topicName and appMsg parameters.] */
        result = create_msg_object(packetId, qosValue);
        if (result == NULL)
        {
            /* Codes_SRS_MQTTMESSAGE_07_028: [If any memory allocation fails mqttmessage_create_in_place shall free any allocated memory and return NULL.] */
            LogError("Failure creating message object");
        }
        else
        {
            if (mallocAndStrcpy_s(&result->topicName, topicName) != 0)
            {
                /* Codes_SRS_MQTTMESSAGE_07_003: [If any memory allocation fails mqttmessage_create shall free any allocated memory and return NULL.] */
                LogError("Failure allocating topic name");
                free(result);
                result = NULL;
            }
            else
            {
                /* Codes_SRS_MQTTMESSAGE_07_002: [mqttmessage_create shall allocate and copy the topicName and appMsg parameters.] */
                result->appPayload.length = appMsgLength;
                if (result->appPayload.length > 0)
                {
                    result->appPayload.message = malloc(appMsgLength);
                    if (result->appPayload.message == NULL)
                    {
                        /* Codes_SRS_MQTTMESSAGE_07_003: [If any memory allocation fails mqttmessage_create shall free any allocated memory and return NULL.] */
                        LogError("Failure allocating message value of %lu", (unsigned long)appMsgLength);
                        free(result->topicName);
                        free(result);
                        result = NULL;
                    }
                    else
                    {
                        (void)memcpy(result->appPayload.message, appMsg, appMsgLength);
                    }
                }
                else
                {
                    result->appPayload.message = NULL;
                }
            }
        }
    }
    /* Codes_SRS_MQTTMESSAGE_07_004: [If mqttmessage_createMessage succeeds the it shall return a NON-NULL MQTT_MESSAGE_HANDLE value.] */
    return (MQTT_MESSAGE_HANDLE)result;
}